

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-binary-reader.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c824::BinaryReaderError::~BinaryReaderError(BinaryReaderError *this)

{
  BinaryReaderError *this_local;
  
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderError_003fa078;
  wabt::Error::~Error(&this->first_error);
  wabt::BinaryReaderNop::~BinaryReaderNop(&this->super_BinaryReaderNop);
  return;
}

Assistant:

bool OnError(const Error& error) override {
    first_error = error;
    return true;  // Error handled.
  }